

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minigzip.c
# Opt level: O3

void gz_uncompress(gzFile in,FILE *out)

{
  bool bVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  FILE *pFVar7;
  gzFile pgVar8;
  char *pcVar9;
  ulong unaff_RBP;
  char *pcVar10;
  char *pcVar11;
  FILE *__s;
  char *pcVar12;
  gzFile unaff_R12;
  ulong uVar13;
  char *pcVar14;
  bool bVar15;
  int err;
  char buf [16384];
  undefined4 uStack_48c0;
  undefined1 uStack_48bc;
  char *pcStack_48a8;
  gzFile pgStack_48a0;
  undefined8 uStack_4880;
  char acStack_4878 [1032];
  FILE *pFStack_4470;
  char acStack_4450 [1024];
  gzFile pgStack_4050;
  FILE *pFStack_4048;
  code *pcStack_4040;
  char local_402c [4];
  char local_4028 [16392];
  
  pcVar14 = local_402c + 4;
  do {
    pcStack_4040 = (code *)0x101600;
    pcVar10 = pcVar14;
    uVar3 = gzread(in,pcVar14,0x4000);
    if ((int)uVar3 < 0) {
      pcVar10 = local_402c;
      pcStack_4040 = (code *)0x101656;
      __s = (FILE *)in;
      gz_uncompress_cold_4();
      goto LAB_00101656;
    }
    if (uVar3 == 0) goto LAB_00101623;
    unaff_RBP = (ulong)uVar3;
    pcVar10 = (char *)0x1;
    pcStack_4040 = (code *)0x10161a;
    sVar6 = fwrite(pcVar14,1,(ulong)uVar3,(FILE *)out);
  } while (uVar3 == (uint)sVar6);
  pcStack_4040 = (code *)0x101623;
  gz_uncompress_cold_1();
LAB_00101623:
  pcStack_4040 = (code *)0x10162b;
  __s = out;
  iVar4 = fclose((FILE *)out);
  if (iVar4 == 0) {
    pcStack_4040 = (code *)0x101637;
    __s = (FILE *)in;
    iVar4 = gzclose();
    if (iVar4 == 0) {
      return;
    }
  }
  else {
LAB_00101656:
    pcStack_4040 = (code *)0x10165b;
    gz_uncompress_cold_2();
  }
  pcStack_4040 = file_compress;
  gz_uncompress_cold_3();
  pcVar12 = acStack_4450;
  pcVar11 = pcVar10;
  pgStack_4050 = in;
  pFStack_4048 = out;
  pcStack_4040 = (code *)pcVar14;
  sVar6 = strlen((char *)__s);
  if (sVar6 - 0x3fd < 0xfffffffffffffc00) {
    file_compress_cold_3();
LAB_001016f1:
    pcVar10 = pcVar11;
    file_compress_cold_2();
  }
  else {
    snprintf(acStack_4450,0x400,"%s%s",__s,".gz");
    pcVar11 = "rb";
    pFVar7 = fopen((char *)__s,"rb");
    if (pFVar7 == (FILE *)0x0) goto LAB_001016f1;
    pgVar8 = (gzFile)gzopen(acStack_4450);
    if (pgVar8 != (gzFile)0x0) {
      gz_compress((FILE *)pFVar7,pgVar8);
      unlink((char *)__s);
      return;
    }
  }
  file_compress_cold_1();
  pcVar14 = acStack_4878;
  uStack_4880 = (code *)0x101717;
  pFStack_4470 = __s;
  sVar6 = strlen(pcVar12);
  if (sVar6 - 0x3fd < 0xfffffffffffffc00) {
    uStack_4880 = (code *)0x1017ee;
    file_uncompress_cold_3();
LAB_001017ee:
    pgVar8 = unaff_R12;
    uStack_4880 = (code *)0x1017f6;
    file_uncompress_cold_2();
  }
  else {
    unaff_R12 = (gzFile)0x400;
    uStack_4880 = (code *)0x10174e;
    snprintf(acStack_4878,0x400,"%s",pcVar12);
    if (sVar6 < 4) {
LAB_0010176c:
      unaff_R12 = (gzFile)(0x400 - sVar6);
      uStack_4880 = (code *)0x10178b;
      snprintf(acStack_4878 + sVar6,(size_t)unaff_R12,"%s",".gz");
      pcVar11 = acStack_4878;
      pcVar14 = pcVar12;
    }
    else {
      uStack_4880 = (code *)0x101768;
      iVar4 = strcmp(pcVar12 + (sVar6 - 3),".gz");
      if (iVar4 != 0) goto LAB_0010176c;
      acStack_4878[sVar6 - 3] = '\0';
      pcVar11 = pcVar12;
    }
    pcVar10 = "rb";
    uStack_4880 = (code *)0x10179d;
    pgVar8 = (gzFile)gzopen(pcVar11);
    if (pgVar8 == (gzFile)0x0) goto LAB_001017ee;
    pcVar10 = "wb";
    uStack_4880 = (code *)0x1017b4;
    pFVar7 = fopen(pcVar14,"wb");
    if (pFVar7 != (FILE *)0x0) {
      uStack_4880 = (code *)0x1017c4;
      gz_uncompress(pgVar8,(FILE *)pFVar7);
      uStack_4880 = (code *)0x1017cc;
      unlink(pcVar11);
      return;
    }
  }
  uStack_4880 = main;
  pcVar11 = pcVar12;
  file_uncompress_cold_1();
  uVar13 = (ulong)pcVar11 & 0xffffffff;
  uStack_48bc = 0;
  uStack_48c0 = 0x20366277;
  pcVar14 = *(char **)pcVar10;
  prog = pcVar14;
  pcStack_48a8 = pcVar12;
  pgStack_48a0 = pgVar8;
  uStack_4880 = (code *)unaff_RBP;
  pcVar9 = strrchr(pcVar14,0x2f);
  pcVar12 = pcVar9 + 1;
  if (pcVar9 == (char *)0x0) {
    pcVar12 = pcVar14;
  }
  iVar4 = strcmp(pcVar12,"gunzip");
  if (iVar4 == 0) {
    bVar15 = true;
    bVar1 = false;
  }
  else {
    iVar4 = strcmp(pcVar12,"zcat");
    bVar15 = iVar4 == 0;
    bVar1 = bVar15;
  }
  pcVar10 = pcVar10 + 8;
  iVar4 = (int)pcVar11 + -1;
  if ((int)pcVar11 < 2) {
LAB_00101936:
    uStack_48c0 = uStack_48c0 & 0xffffff;
  }
  else {
    cVar2 = ' ';
    do {
      pcVar14 = *(char **)pcVar10;
      if (*pcVar14 != '-') goto LAB_00101932;
      if ((pcVar14[1] == 'c') && (pcVar14[2] == '\0')) {
        bVar1 = true;
      }
      else if ((pcVar14[1] == 'd') && (pcVar14[2] == '\0')) {
        bVar15 = true;
      }
      else if ((pcVar14[1] == 'f') && (pcVar14[2] == '\0')) {
        uStack_48c0 = CONCAT13(0x66,(undefined3)uStack_48c0);
        cVar2 = 'f';
      }
      else if ((pcVar14[1] == 'h') && (pcVar14[2] == '\0')) {
        uStack_48c0 = CONCAT13(0x68,(undefined3)uStack_48c0);
        cVar2 = 'h';
      }
      else if ((pcVar14[1] == 'r') && (pcVar14[2] == '\0')) {
        uStack_48c0 = CONCAT13(0x52,(undefined3)uStack_48c0);
        cVar2 = 'R';
      }
      else {
        if (8 < (byte)(pcVar14[1] - 0x31U)) goto LAB_00101932;
        if (pcVar14[2] != '\0') {
          iVar4 = (int)uVar13 + -1;
          goto LAB_00101932;
        }
        uStack_48c0._0_3_ = CONCAT12(pcVar14[1],(undefined2)uStack_48c0);
      }
      pcVar10 = pcVar10 + 8;
      iVar4 = iVar4 + -1;
      uVar3 = (int)uVar13 - 1;
      uVar13 = (ulong)uVar3;
    } while (1 < (int)uVar3);
    iVar4 = 0;
LAB_00101932:
    if (cVar2 == ' ') goto LAB_00101936;
  }
  if (iVar4 == 0) {
    if (bVar15) {
      iVar4 = fileno(_stdin);
      pgVar8 = (gzFile)gzdopen(iVar4,"rb");
      if (pgVar8 == (gzFile)0x0) {
LAB_00101a6e:
        main_cold_3();
LAB_00101a73:
        main_cold_4();
        return;
      }
      gz_uncompress(pgVar8,(FILE *)_stdout);
    }
    else {
      iVar4 = fileno(_stdout);
      pgVar8 = (gzFile)gzdopen(iVar4,&uStack_48c0);
      if (pgVar8 == (gzFile)0x0) goto LAB_00101a73;
      gz_compress((FILE *)_stdin,pgVar8);
    }
  }
  else {
    do {
      pcVar14 = *(char **)pcVar10;
      if (bVar15) {
        if (bVar1) {
          pgVar8 = (gzFile)gzopen(pcVar14,"rb");
          if (pgVar8 == (gzFile)0x0) {
            main_cold_1();
          }
          else {
            gz_uncompress(pgVar8,(FILE *)_stdout);
          }
        }
        else {
          file_uncompress(pcVar14);
        }
      }
      else if (bVar1) {
        pFVar7 = fopen(pcVar14,"rb");
        if (pFVar7 == (FILE *)0x0) {
          perror(*(char **)pcVar10);
        }
        else {
          iVar5 = fileno(_stdout);
          pgVar8 = (gzFile)gzdopen(iVar5,&uStack_48c0);
          if (pgVar8 == (gzFile)0x0) {
            main_cold_2();
            goto LAB_00101a6e;
          }
          gz_compress((FILE *)pFVar7,pgVar8);
        }
      }
      else {
        file_compress(pcVar14,(char *)&uStack_48c0);
      }
      pcVar10 = pcVar10 + 8;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  return;
}

Assistant:

void gz_uncompress(in, out)
    gzFile in;
    FILE   *out;
{
    local char buf[BUFLEN];
    int len;
    int err;

    for (;;) {
        len = gzread(in, buf, sizeof(buf));
        if (len < 0) error (gzerror(in, &err));
        if (len == 0) break;

        if ((int)fwrite(buf, 1, (unsigned)len, out) != len) {
            error("failed fwrite");
        }
    }
    if (fclose(out)) error("failed fclose");

    if (gzclose(in) != Z_OK) error("failed gzclose");
}